

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelConnects,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcRoot *this;
  
  this = (IfcRoot *)operator_new(0xc0);
  this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = (_WordT)&PTR__Object_007e6a70;
  *(undefined8 *)&this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10 = 0;
  *(char **)&this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x18 =
       "IfcRelConnects";
  Assimp::IFC::Schema_2x3::IfcRoot::IfcRoot(this,&PTR_construction_vtable_24__007eaba8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRelConnects_007eab10;
  this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = (_WordT)&PTR__IfcRelConnects_007eab88;
  *(undefined ***)&this->field_0x88 = &PTR__IfcRelConnects_007eab38;
  *(undefined ***)&this->field_0x98 = &PTR__IfcRelConnects_007eab60;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRelConnects>(db,params,(IfcRelConnects *)this);
  return (Object *)
         ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).
                 _vptr_ObjectHelper +
         (long)(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>)._vptr_ObjectHelper
               [-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }